

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::GetStateBlock
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *mD)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,0xc,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,0xf,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 0x140);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,0x12,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzDD + 400);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_68,mD,0x15,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  return;
}

Assistant:

void ChElementBeamANCF_3243::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(9, 3) = m_nodes[0]->GetDDD().eigen();

    mD.segment(12, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(15, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(18, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(21, 3) = m_nodes[1]->GetDDD().eigen();
}